

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_serve_static_content.cpp
# Opt level: O2

void __thiscall
ServeStaticContent_MissingFile_Test::TestBody(ServeStaticContent_MissingFile_Test *this)

{
  char *message;
  error_code eVar1;
  error_code local_70;
  error_code local_60;
  AssertionResult gtest_ar;
  error_or<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> actual;
  
  std::__cxx11::string::string((string *)&gtest_ar,"/foo.html",(allocator *)&local_70);
  anon_unknown.dwarf_ce6d8::ServeStaticContent::serve_path
            (&actual,&this->super_ServeStaticContent,(string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  eVar1 = pstore::
          error_or<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::get_error(&actual);
  local_70._M_cat = eVar1._M_cat;
  local_70._M_value = eVar1._M_value;
  eVar1 = pstore::romfs::make_error_code(enoent);
  local_60._M_cat = eVar1._M_cat;
  local_60._M_value = eVar1._M_value;
  testing::internal::CmpHelperEQ<std::error_code,std::error_code>
            ((internal *)&gtest_ar,"actual.get_error ()",
             "make_error_code (pstore::romfs::error_code::enoent)",&local_70,&local_60);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_70);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_serve_static_content.cpp"
               ,0x95,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
    if ((long *)CONCAT44(local_70._4_4_,local_70._M_value) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_70._4_4_,local_70._M_value) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  pstore::error_or<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~error_or(&actual);
  return;
}

Assistant:

TEST_F (ServeStaticContent, MissingFile) {
    pstore::error_or<std::string> const actual = serve_path ("/foo.html");
    EXPECT_EQ (actual.get_error (), make_error_code (pstore::romfs::error_code::enoent));
}